

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_avx2.c
# Opt level: O1

void fill_block(block *prev_block,block *ref_block,block *next_block,int with_xor)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint64_t uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  block blockR;
  block block_tmp;
  ulong auStack_bb8 [16];
  ulong auStack_b38 [16];
  ulong auStack_ab8 [16];
  ulong auStack_a38 [16];
  ulong auStack_9b8 [16];
  ulong auStack_938 [16];
  ulong auStack_8b8 [16];
  block *local_838;
  undefined8 local_830;
  undefined8 uStack_828;
  ulong auStack_7b0 [112];
  uint local_430 [256];
  
  auStack_8b8[9] = 0x119f8e;
  memcpy(&local_830,ref_block,0x400);
  lVar10 = 0;
  do {
    puVar1 = prev_block->v + lVar10;
    uVar4 = *(uint *)((long)puVar1 + 4);
    uVar9 = puVar1[1];
    uVar5 = *(uint *)((long)puVar1 + 0xc);
    uVar6 = *(uint *)((long)&local_830 + lVar10 * 8 + 4);
    uVar7 = *(uint *)(&uStack_828 + lVar10);
    uVar8 = *(uint *)((long)&uStack_828 + lVar10 * 8 + 4);
    *(uint *)(&local_830 + lVar10) = *(uint *)(&local_830 + lVar10) ^ (uint)*puVar1;
    *(uint *)((long)&local_830 + lVar10 * 8 + 4) = uVar6 ^ uVar4;
    *(uint *)(&uStack_828 + lVar10) = uVar7 ^ (uint)uVar9;
    *(uint *)((long)&uStack_828 + lVar10 * 8 + 4) = uVar8 ^ uVar5;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 0x80);
  auStack_8b8[9] = 0x119fc5;
  memcpy(local_430,&local_830,0x400);
  if (with_xor != 0) {
    lVar10 = 0;
    do {
      puVar1 = next_block->v + lVar10;
      uVar4 = *(uint *)((long)puVar1 + 4);
      uVar9 = puVar1[1];
      uVar5 = *(uint *)((long)puVar1 + 0xc);
      uVar6 = local_430[lVar10 * 2 + 1];
      uVar7 = local_430[lVar10 * 2 + 2];
      uVar8 = local_430[lVar10 * 2 + 3];
      local_430[lVar10 * 2] = local_430[lVar10 * 2] ^ (uint)*puVar1;
      local_430[lVar10 * 2 + 1] = uVar6 ^ uVar4;
      local_430[lVar10 * 2 + 2] = uVar7 ^ (uint)uVar9;
      local_430[lVar10 * 2 + 3] = uVar8 ^ uVar5;
      lVar10 = lVar10 + 2;
    } while (lVar10 != 0x80);
  }
  lVar10 = 0x78;
  do {
    uVar19 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x30);
    lVar3 = *(long *)((long)auStack_8b8 + lVar10 + 0x10);
    uVar28 = (lVar3 * 2 & 0x1fffffffeU) * (uVar19 & 0xffffffff) + uVar19 + lVar3;
    uVar20 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x70) ^ uVar28;
    uVar16 = uVar20 >> 0x20;
    uVar21 = uVar20 << 0x20 | uVar16;
    lVar3 = *(long *)((long)auStack_8b8 + lVar10 + 0x50);
    uVar17 = (lVar3 * 2 & 0x1fffffffeU) * uVar16 + uVar21 + lVar3;
    uVar16 = (uVar19 ^ uVar17) >> 0x18;
    uVar20 = (uVar19 ^ uVar17) << 0x28 | uVar16;
    lVar3 = *(long *)((long)auStack_8b8 + lVar10 + 0x18);
    uVar29 = (uVar28 * 2 & 0x1fffffffe) * (uVar16 & 0xffffffff) + uVar20 + uVar28;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x10) = uVar29;
    uVar21 = uVar21 ^ uVar29;
    uVar19 = uVar21 >> 0x10;
    uVar22 = uVar21 << 0x30 | uVar19;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x70) = uVar22;
    uVar18 = (uVar17 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar22 + uVar17;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x50) = uVar18;
    uVar20 = uVar20 ^ uVar18;
    uVar16 = uVar20 << 1;
    uVar21 = (ulong)((long)uVar20 < 0);
    uVar14 = uVar16 | uVar21;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x30) = uVar14;
    uVar19 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x38);
    uVar26 = (lVar3 * 2 & 0x1fffffffeU) * (uVar19 & 0xffffffff) + lVar3 + uVar19;
    uVar17 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x78) ^ uVar26;
    uVar20 = uVar17 >> 0x20;
    uVar23 = uVar17 << 0x20 | uVar20;
    lVar3 = *(long *)((long)auStack_8b8 + lVar10 + 0x58);
    uVar28 = (lVar3 * 2 & 0x1fffffffeU) * uVar20 + uVar23 + lVar3;
    uVar20 = (uVar19 ^ uVar28) >> 0x18;
    uVar17 = (uVar19 ^ uVar28) << 0x28 | uVar20;
    uVar27 = (uVar26 * 2 & 0x1fffffffe) * (uVar20 & 0xffffffff) + uVar26 + uVar17;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x18) = uVar27;
    uVar23 = uVar23 ^ uVar27;
    uVar19 = uVar23 >> 0x10;
    uVar24 = uVar23 << 0x30 | uVar19;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x78) = uVar24;
    uVar15 = (uVar28 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar24 + uVar28;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x58) = uVar15;
    uVar17 = uVar17 ^ uVar15;
    uVar20 = uVar17 << 1;
    uVar28 = (ulong)((long)uVar17 < 0);
    uVar13 = uVar20 | uVar28;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x38) = uVar13;
    lVar3 = *(long *)((long)auStack_8b8 + lVar10 + 0x20);
    uVar19 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x40);
    uVar32 = (lVar3 * 2 & 0x1fffffffeU) * (uVar19 & 0xffffffff) + lVar3 + uVar19;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x20) = uVar32;
    uVar23 = *(ulong *)((long)&local_838 + lVar10) ^ uVar32;
    uVar17 = uVar23 >> 0x20;
    uVar26 = uVar23 << 0x20 | uVar17;
    *(ulong *)((long)&local_838 + lVar10) = uVar26;
    lVar3 = *(long *)((long)auStack_8b8 + lVar10 + 0x60);
    uVar23 = (lVar3 * 2 & 0x1fffffffeU) * uVar17 + uVar26 + lVar3;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x60) = uVar23;
    uVar17 = (uVar19 ^ uVar23) >> 0x18;
    uVar30 = (uVar19 ^ uVar23) << 0x28 | uVar17;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x40) = uVar30;
    uVar33 = (uVar32 * 2 & 0x1fffffffe) * (uVar17 & 0xffffffff) + uVar32 + uVar30;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x20) = uVar33;
    uVar19 = (uVar26 ^ uVar33) >> 0x10;
    uVar25 = (uVar26 ^ uVar33) << 0x30 | uVar19;
    *(ulong *)((long)&local_838 + lVar10) = uVar25;
    uVar32 = (uVar23 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar25 + uVar23;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x60) = uVar32;
    uVar17 = (uVar30 ^ uVar32) << 1;
    uVar23 = (ulong)((long)(uVar30 ^ uVar32) < 0);
    uVar31 = uVar17 | uVar23;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x40) = uVar31;
    lVar3 = *(long *)((long)auStack_8b8 + lVar10 + 0x28);
    uVar19 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x48);
    uVar34 = (lVar3 * 2 & 0x1fffffffeU) * (uVar19 & 0xffffffff) + uVar19 + lVar3;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x28) = uVar34;
    uVar30 = *(ulong *)((long)&local_830 + lVar10) ^ uVar34;
    uVar26 = uVar30 >> 0x20;
    uVar11 = uVar30 << 0x20 | uVar26;
    *(ulong *)((long)&local_830 + lVar10) = uVar11;
    lVar3 = *(long *)((long)auStack_8b8 + lVar10 + 0x68);
    uVar30 = (lVar3 * 2 & 0x1fffffffeU) * uVar26 + uVar11 + lVar3;
    uVar26 = (uVar19 ^ uVar30) >> 0x18;
    uVar12 = (uVar19 ^ uVar30) << 0x28 | uVar26;
    uVar34 = (uVar34 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar12 + uVar34;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x68) = uVar30;
    uVar19 = (uVar11 ^ uVar34) >> 0x10;
    uVar26 = (uVar11 ^ uVar34) << 0x30 | uVar19;
    uVar29 = (uVar29 * 2 & 0x1fffffffe) * (uVar20 & 0xffffffff | uVar28) + uVar29 + uVar13;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x48) = uVar12;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x28) = uVar34;
    *(ulong *)((long)&local_830 + lVar10) = uVar26;
    uVar20 = (uVar26 ^ uVar29) >> 0x20;
    uVar11 = (uVar26 ^ uVar29) << 0x20 | uVar20;
    uVar30 = (uVar30 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar26 + uVar30;
    uVar26 = (uVar32 * 2 & 0x1fffffffe) * uVar20 + uVar11 + uVar32;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x68) = uVar30;
    uVar19 = (uVar12 ^ uVar30) << 1;
    uVar20 = (ulong)((long)(uVar12 ^ uVar30) < 0);
    uVar32 = uVar19 | uVar20;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x48) = uVar32;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x10) = uVar29;
    uVar28 = (uVar13 ^ uVar26) >> 0x18;
    uVar12 = (uVar13 ^ uVar26) << 0x28 | uVar28;
    uVar13 = (uVar29 * 2 & 0x1fffffffe) * (uVar28 & 0xffffffff) + uVar29 + uVar12;
    *(ulong *)((long)&local_830 + lVar10) = uVar11;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x60) = uVar26;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x10) = uVar13;
    uVar13 = uVar13 ^ uVar11;
    uVar28 = uVar13 >> 0x10;
    uVar11 = uVar13 << 0x30 | uVar28;
    *(ulong *)((long)&local_830 + lVar10) = uVar11;
    uVar28 = (uVar26 * 2 & 0x1fffffffe) * (uVar28 & 0xffffffff) + uVar11 + uVar26;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x60) = uVar28;
    uVar28 = uVar28 ^ uVar12;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x38) = uVar28 << 1 | (ulong)((long)uVar28 < 0);
    uVar26 = (uVar27 * 2 & 0x1fffffffe) * (uVar17 & 0xffffffff | uVar23) + uVar27 + uVar31;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x18) = uVar26;
    uVar17 = (uVar22 ^ uVar26) >> 0x20;
    uVar23 = (uVar22 ^ uVar26) << 0x20 | uVar17;
    uVar28 = (uVar30 * 2 & 0x1fffffffe) * uVar17 + uVar30 + uVar23;
    uVar17 = (uVar31 ^ uVar28) >> 0x18;
    uVar30 = (uVar31 ^ uVar28) << 0x28 | uVar17;
    uVar26 = (uVar26 * 2 & 0x1fffffffe) * (uVar17 & 0xffffffff) + uVar26 + uVar30;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x70) = uVar23;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x68) = uVar28;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x18) = uVar26;
    uVar26 = uVar26 ^ uVar23;
    uVar17 = uVar26 >> 0x10;
    uVar23 = uVar26 << 0x30 | uVar17;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x70) = uVar23;
    uVar17 = (uVar28 * 2 & 0x1fffffffe) * (uVar17 & 0xffffffff) + uVar23 + uVar28;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x68) = uVar17;
    uVar17 = uVar17 ^ uVar30;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x40) = uVar17 << 1 | (ulong)((long)uVar17 < 0);
    uVar23 = (uVar33 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff | uVar20) + uVar32 + uVar33;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x20) = uVar23;
    uVar19 = (uVar24 ^ uVar23) >> 0x20;
    uVar28 = (uVar24 ^ uVar23) << 0x20 | uVar19;
    uVar17 = (uVar18 * 2 & 0x1fffffffe) * uVar19 + uVar28 + uVar18;
    uVar19 = (uVar32 ^ uVar17) >> 0x18;
    uVar20 = (uVar32 ^ uVar17) << 0x28 | uVar19;
    uVar23 = (uVar23 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar20 + uVar23;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x78) = uVar28;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x50) = uVar17;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x20) = uVar23;
    uVar23 = uVar23 ^ uVar28;
    uVar19 = uVar23 >> 0x10;
    uVar28 = uVar23 << 0x30 | uVar19;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x78) = uVar28;
    uVar19 = (uVar17 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar28 + uVar17;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x50) = uVar19;
    uVar19 = uVar19 ^ uVar20;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x48) = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    uVar21 = (uVar34 * 2 & 0x1fffffffe) * (uVar16 & 0xffffffff | uVar21) + uVar34 + uVar14;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x28) = uVar21;
    uVar19 = (uVar25 ^ uVar21) >> 0x20;
    uVar17 = (uVar25 ^ uVar21) << 0x20 | uVar19;
    uVar16 = (uVar15 * 2 & 0x1fffffffe) * uVar19 + uVar17 + uVar15;
    uVar19 = (uVar14 ^ uVar16) >> 0x18;
    uVar20 = (uVar14 ^ uVar16) << 0x28 | uVar19;
    uVar21 = (uVar21 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar20 + uVar21;
    *(ulong *)((long)&local_838 + lVar10) = uVar17;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x58) = uVar16;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x28) = uVar21;
    uVar21 = uVar21 ^ uVar17;
    uVar19 = uVar21 >> 0x10;
    uVar17 = uVar21 << 0x30 | uVar19;
    *(ulong *)((long)&local_838 + lVar10) = uVar17;
    uVar19 = (uVar16 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar17 + uVar16;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x58) = uVar19;
    uVar19 = uVar19 ^ uVar20;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x30) = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    lVar10 = lVar10 + 0x80;
  } while (lVar10 != 0x478);
  lVar10 = 0x388;
  do {
    uVar19 = *(ulong *)((long)auStack_ab8 + lVar10);
    uVar28 = (*(long *)((long)auStack_bb8 + lVar10) * 2 & 0x1fffffffeU) * (uVar19 & 0xffffffff) +
             uVar19 + *(long *)((long)auStack_bb8 + lVar10);
    uVar20 = *(ulong *)((long)auStack_8b8 + lVar10) ^ uVar28;
    uVar16 = uVar20 >> 0x20;
    uVar21 = uVar20 << 0x20 | uVar16;
    uVar17 = (*(long *)((long)auStack_9b8 + lVar10) * 2 & 0x1fffffffeU) * uVar16 +
             uVar21 + *(long *)((long)auStack_9b8 + lVar10);
    uVar16 = (uVar19 ^ uVar17) >> 0x18;
    uVar20 = (uVar19 ^ uVar17) << 0x28 | uVar16;
    lVar3 = *(long *)((long)auStack_bb8 + lVar10 + 8);
    uVar22 = (uVar28 * 2 & 0x1fffffffe) * (uVar16 & 0xffffffff) + uVar20 + uVar28;
    *(ulong *)((long)auStack_bb8 + lVar10) = uVar22;
    uVar21 = uVar21 ^ uVar22;
    uVar19 = uVar21 >> 0x10;
    auStack_8b8[0xc] = uVar21 << 0x30 | uVar19;
    *(ulong *)((long)auStack_8b8 + lVar10) = auStack_8b8[0xc];
    uVar15 = (uVar17 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + auStack_8b8[0xc] + uVar17;
    *(ulong *)((long)auStack_9b8 + lVar10) = uVar15;
    uVar20 = uVar20 ^ uVar15;
    uVar16 = uVar20 << 1;
    uVar21 = (ulong)((long)uVar20 < 0);
    auStack_8b8[0xf] = uVar16 | uVar21;
    *(ulong *)((long)auStack_ab8 + lVar10) = auStack_8b8[0xf];
    uVar19 = *(ulong *)((long)auStack_ab8 + lVar10 + 8);
    uVar26 = (lVar3 * 2 & 0x1fffffffeU) * (uVar19 & 0xffffffff) + uVar19 + lVar3;
    uVar17 = *(ulong *)((long)auStack_8b8 + lVar10 + 8) ^ uVar26;
    uVar20 = uVar17 >> 0x20;
    uVar23 = uVar17 << 0x20 | uVar20;
    lVar3 = *(long *)((long)auStack_9b8 + lVar10 + 8);
    uVar28 = (lVar3 * 2 & 0x1fffffffeU) * uVar20 + uVar23 + lVar3;
    uVar20 = (uVar19 ^ uVar28) >> 0x18;
    uVar17 = (uVar19 ^ uVar28) << 0x28 | uVar20;
    uVar18 = (uVar26 * 2 & 0x1fffffffe) * (uVar20 & 0xffffffff) + uVar17 + uVar26;
    *(ulong *)((long)auStack_bb8 + lVar10 + 8) = uVar18;
    uVar23 = uVar23 ^ uVar18;
    uVar19 = uVar23 >> 0x10;
    auStack_8b8[0xe] = uVar23 << 0x30 | uVar19;
    *(ulong *)((long)auStack_8b8 + lVar10 + 8) = auStack_8b8[0xe];
    uVar14 = (uVar28 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + auStack_8b8[0xe] + uVar28;
    *(ulong *)((long)auStack_9b8 + lVar10 + 8) = uVar14;
    uVar17 = uVar17 ^ uVar14;
    uVar20 = uVar17 << 1;
    uVar28 = (ulong)((long)uVar17 < 0);
    uVar12 = uVar20 | uVar28;
    *(ulong *)((long)auStack_ab8 + lVar10 + 8) = uVar12;
    uVar19 = *(ulong *)((long)auStack_a38 + lVar10);
    uVar32 = (*(long *)((long)auStack_b38 + lVar10) * 2 & 0x1fffffffeU) * (uVar19 & 0xffffffff) +
             *(long *)((long)auStack_b38 + lVar10) + uVar19;
    *(ulong *)((long)auStack_b38 + lVar10) = uVar32;
    uVar23 = *(ulong *)((long)&local_838 + lVar10) ^ uVar32;
    uVar17 = uVar23 >> 0x20;
    uVar26 = uVar23 << 0x20 | uVar17;
    *(ulong *)((long)&local_838 + lVar10) = uVar26;
    uVar23 = (*(long *)((long)auStack_938 + lVar10) * 2 & 0x1fffffffeU) * uVar17 +
             uVar26 + *(long *)((long)auStack_938 + lVar10);
    *(ulong *)((long)auStack_938 + lVar10) = uVar23;
    uVar17 = (uVar19 ^ uVar23) >> 0x18;
    uVar30 = (uVar19 ^ uVar23) << 0x28 | uVar17;
    *(ulong *)((long)auStack_a38 + lVar10) = uVar30;
    uVar25 = (uVar32 * 2 & 0x1fffffffe) * (uVar17 & 0xffffffff) + uVar32 + uVar30;
    *(ulong *)((long)auStack_b38 + lVar10) = uVar25;
    uVar19 = (uVar26 ^ uVar25) >> 0x10;
    auStack_8b8[0xd] = (uVar26 ^ uVar25) << 0x30 | uVar19;
    *(ulong *)((long)&local_838 + lVar10) = auStack_8b8[0xd];
    uVar32 = (uVar23 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + auStack_8b8[0xd] + uVar23;
    *(ulong *)((long)auStack_938 + lVar10) = uVar32;
    uVar17 = (uVar30 ^ uVar32) << 1;
    uVar23 = (ulong)((long)(uVar30 ^ uVar32) < 0);
    uVar24 = uVar17 | uVar23;
    *(ulong *)((long)auStack_a38 + lVar10) = uVar24;
    lVar3 = *(long *)((long)auStack_b38 + lVar10 + 8);
    uVar19 = *(ulong *)((long)auStack_a38 + lVar10 + 8);
    uVar27 = (lVar3 * 2 & 0x1fffffffeU) * (uVar19 & 0xffffffff) + lVar3 + uVar19;
    *(ulong *)((long)auStack_b38 + lVar10 + 8) = uVar27;
    uVar30 = *(ulong *)((long)&local_830 + lVar10) ^ uVar27;
    uVar26 = uVar30 >> 0x20;
    uVar11 = uVar30 << 0x20 | uVar26;
    *(ulong *)((long)&local_830 + lVar10) = uVar11;
    lVar3 = *(long *)((long)auStack_938 + lVar10 + 8);
    uVar30 = (lVar3 * 2 & 0x1fffffffeU) * uVar26 + uVar11 + lVar3;
    uVar26 = (uVar19 ^ uVar30) >> 0x18;
    uVar13 = (uVar19 ^ uVar30) << 0x28 | uVar26;
    uVar27 = (uVar27 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar27 + uVar13;
    *(ulong *)((long)auStack_938 + lVar10 + 8) = uVar30;
    uVar19 = (uVar11 ^ uVar27) >> 0x10;
    uVar26 = (uVar11 ^ uVar27) << 0x30 | uVar19;
    auStack_8b8[0xb] = uVar26 + uVar30;
    uVar22 = (uVar22 * 2 & 0x1fffffffe) * (uVar20 & 0xffffffff | uVar28) + uVar12 + uVar22;
    *(ulong *)((long)auStack_a38 + lVar10 + 8) = uVar13;
    *(ulong *)((long)auStack_b38 + lVar10 + 8) = uVar27;
    *(ulong *)((long)&local_830 + lVar10) = uVar26;
    uVar20 = (uVar26 ^ uVar22) >> 0x20;
    uVar11 = (uVar26 ^ uVar22) << 0x20 | uVar20;
    uVar30 = (uVar30 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + auStack_8b8[0xb];
    uVar26 = (uVar32 * 2 & 0x1fffffffe) * uVar20 + uVar11 + uVar32;
    *(ulong *)((long)auStack_938 + lVar10 + 8) = uVar30;
    uVar19 = (uVar13 ^ uVar30) << 1;
    uVar20 = (ulong)((long)(uVar13 ^ uVar30) < 0);
    uVar13 = uVar19 | uVar20;
    *(ulong *)((long)auStack_a38 + lVar10 + 8) = uVar13;
    *(ulong *)((long)auStack_bb8 + lVar10) = uVar22;
    uVar28 = (uVar12 ^ uVar26) >> 0x18;
    uVar32 = (uVar12 ^ uVar26) << 0x28 | uVar28;
    uVar12 = (uVar22 * 2 & 0x1fffffffe) * (uVar28 & 0xffffffff) + uVar32 + uVar22;
    *(ulong *)((long)&local_830 + lVar10) = uVar11;
    *(ulong *)((long)auStack_938 + lVar10) = uVar26;
    *(ulong *)((long)auStack_bb8 + lVar10) = uVar12;
    uVar12 = uVar12 ^ uVar11;
    uVar28 = uVar12 >> 0x10;
    uVar11 = uVar12 << 0x30 | uVar28;
    *(ulong *)((long)&local_830 + lVar10) = uVar11;
    uVar28 = (uVar26 * 2 & 0x1fffffffe) * (uVar28 & 0xffffffff) + uVar11 + uVar26;
    *(ulong *)((long)auStack_938 + lVar10) = uVar28;
    uVar28 = uVar28 ^ uVar32;
    *(ulong *)((long)auStack_ab8 + lVar10 + 8) = uVar28 << 1 | (ulong)((long)uVar28 < 0);
    uVar26 = (uVar18 * 2 & 0x1fffffffe) * (uVar17 & 0xffffffff | uVar23) + uVar18 + uVar24;
    *(ulong *)((long)auStack_bb8 + lVar10 + 8) = uVar26;
    uVar17 = (auStack_8b8[0xc] ^ uVar26) >> 0x20;
    uVar23 = (auStack_8b8[0xc] ^ uVar26) << 0x20 | uVar17;
    uVar28 = (uVar30 * 2 & 0x1fffffffe) * uVar17 + uVar30 + uVar23;
    uVar17 = (uVar24 ^ uVar28) >> 0x18;
    uVar32 = (uVar24 ^ uVar28) << 0x28 | uVar17;
    uVar26 = (uVar26 * 2 & 0x1fffffffe) * (uVar17 & 0xffffffff) + uVar26 + uVar32;
    *(ulong *)((long)auStack_8b8 + lVar10) = uVar23;
    *(ulong *)((long)auStack_938 + lVar10 + 8) = uVar28;
    *(ulong *)((long)auStack_bb8 + lVar10 + 8) = uVar26;
    uVar26 = uVar26 ^ uVar23;
    uVar17 = uVar26 >> 0x10;
    uVar23 = uVar26 << 0x30 | uVar17;
    *(ulong *)((long)auStack_8b8 + lVar10) = uVar23;
    uVar17 = (uVar28 * 2 & 0x1fffffffe) * (uVar17 & 0xffffffff) + uVar23 + uVar28;
    *(ulong *)((long)auStack_938 + lVar10 + 8) = uVar17;
    uVar17 = uVar17 ^ uVar32;
    *(ulong *)((long)auStack_a38 + lVar10) = uVar17 << 1 | (ulong)((long)uVar17 < 0);
    uVar23 = (uVar25 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff | uVar20) + uVar25 + uVar13;
    *(ulong *)((long)auStack_b38 + lVar10) = uVar23;
    uVar19 = (auStack_8b8[0xe] ^ uVar23) >> 0x20;
    uVar28 = (auStack_8b8[0xe] ^ uVar23) << 0x20 | uVar19;
    uVar17 = (uVar15 * 2 & 0x1fffffffe) * uVar19 + uVar28 + uVar15;
    uVar19 = (uVar13 ^ uVar17) >> 0x18;
    uVar20 = (uVar13 ^ uVar17) << 0x28 | uVar19;
    uVar23 = (uVar23 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar23 + uVar20;
    *(ulong *)((long)auStack_8b8 + lVar10 + 8) = uVar28;
    *(ulong *)((long)auStack_9b8 + lVar10) = uVar17;
    *(ulong *)((long)auStack_b38 + lVar10) = uVar23;
    uVar23 = uVar23 ^ uVar28;
    uVar19 = uVar23 >> 0x10;
    uVar28 = uVar23 << 0x30 | uVar19;
    *(ulong *)((long)auStack_8b8 + lVar10 + 8) = uVar28;
    uVar19 = (uVar17 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar28 + uVar17;
    *(ulong *)((long)auStack_9b8 + lVar10) = uVar19;
    uVar19 = uVar19 ^ uVar20;
    *(ulong *)((long)auStack_a38 + lVar10 + 8) = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    uVar21 = (uVar27 * 2 & 0x1fffffffe) * (uVar16 & 0xffffffff | uVar21) + uVar27 + auStack_8b8[0xf]
    ;
    *(ulong *)((long)auStack_b38 + lVar10 + 8) = uVar21;
    uVar19 = (auStack_8b8[0xd] ^ uVar21) >> 0x20;
    uVar17 = (auStack_8b8[0xd] ^ uVar21) << 0x20 | uVar19;
    uVar16 = (uVar14 * 2 & 0x1fffffffe) * uVar19 + uVar17 + uVar14;
    uVar19 = (auStack_8b8[0xf] ^ uVar16) >> 0x18;
    uVar20 = (auStack_8b8[0xf] ^ uVar16) << 0x28 | uVar19;
    uVar21 = (uVar21 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar20 + uVar21;
    *(ulong *)((long)&local_838 + lVar10) = uVar17;
    *(ulong *)((long)auStack_9b8 + lVar10 + 8) = uVar16;
    *(ulong *)((long)auStack_b38 + lVar10 + 8) = uVar21;
    uVar21 = uVar21 ^ uVar17;
    uVar19 = uVar21 >> 0x10;
    uVar17 = uVar21 << 0x30 | uVar19;
    *(ulong *)((long)&local_838 + lVar10) = uVar17;
    uVar19 = (uVar16 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar17 + uVar16;
    *(ulong *)((long)auStack_9b8 + lVar10 + 8) = uVar19;
    uVar19 = uVar19 ^ uVar20;
    *(ulong *)((long)auStack_ab8 + lVar10) = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x408);
  auStack_8b8[9] = 0x11ab55;
  local_838 = next_block;
  memcpy(next_block,local_430,0x400);
  lVar10 = 0;
  do {
    uVar4 = *(uint *)((long)&local_830 + lVar10 * 8 + 4);
    uVar5 = *(uint *)(&uStack_828 + lVar10);
    uVar6 = *(uint *)((long)&uStack_828 + lVar10 * 8 + 4);
    puVar1 = next_block->v + lVar10;
    uVar7 = *(uint *)((long)puVar1 + 4);
    uVar9 = puVar1[1];
    uVar8 = *(uint *)((long)puVar1 + 0xc);
    puVar2 = next_block->v + lVar10;
    *(uint *)puVar2 = (uint)*puVar1 ^ *(uint *)(&local_830 + lVar10);
    *(uint *)((long)puVar2 + 4) = uVar7 ^ uVar4;
    *(uint *)(puVar2 + 1) = (uint)uVar9 ^ uVar5;
    *(uint *)((long)puVar2 + 0xc) = uVar8 ^ uVar6;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 0x80);
  return;
}

Assistant:

static void fill_block(__m256i* state, const block* ref_block,
	block* next_block, int with_xor) {
	__m256i block_XY[ARGON2_HWORDS_IN_BLOCK];
	unsigned int i;

	if (with_xor) {
		for (i = 0; i < ARGON2_HWORDS_IN_BLOCK; i++) {
			state[i] = _mm256_xor_si256(
				state[i], _mm256_loadu_si256((const __m256i*)ref_block->v + i));
			block_XY[i] = _mm256_xor_si256(
				state[i], _mm256_loadu_si256((const __m256i*)next_block->v + i));
		}
	}
	else {
		for (i = 0; i < ARGON2_HWORDS_IN_BLOCK; i++) {
			block_XY[i] = state[i] = _mm256_xor_si256(
				state[i], _mm256_loadu_si256((const __m256i*)ref_block->v + i));
		}
	}

	for (i = 0; i < 4; ++i) {
		BLAKE2_ROUND_1(state[8 * i + 0], state[8 * i + 4], state[8 * i + 1], state[8 * i + 5],
			state[8 * i + 2], state[8 * i + 6], state[8 * i + 3], state[8 * i + 7]);
	}

	for (i = 0; i < 4; ++i) {
		BLAKE2_ROUND_2(state[0 + i], state[4 + i], state[8 + i], state[12 + i],
			state[16 + i], state[20 + i], state[24 + i], state[28 + i]);
	}

	for (i = 0; i < ARGON2_HWORDS_IN_BLOCK; i++) {
		state[i] = _mm256_xor_si256(state[i], block_XY[i]);
		_mm256_storeu_si256((__m256i*)next_block->v + i, state[i]);
	}
}